

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O0

bool __thiscall HighsDomain::ObjectivePropagation::shouldBePropagated(ObjectivePropagation *this)

{
  double dVar1;
  pointer pHVar2;
  long *in_RDI;
  double dVar3;
  double upperLimit;
  bool local_1;
  
  if ((*(byte *)(in_RDI + 7) & 1) == 0) {
    if ((int)in_RDI[5] < 2) {
      if ((*(byte *)(*in_RDI + 0x280) & 1) == 0) {
        pHVar2 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                 operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                             *)0x5c0abe);
        dVar1 = pHVar2->upper_limit;
        if ((dVar1 != INFINITY) || (NAN(dVar1))) {
          dVar3 = HighsCDouble::operator_cast_to_double((HighsCDouble *)(in_RDI + 3));
          if (dVar1 - dVar3 < (double)in_RDI[6] || dVar1 - dVar3 == (double)in_RDI[6]) {
            local_1 = true;
          }
          else {
            local_1 = false;
          }
        }
        else {
          local_1 = false;
        }
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool HighsDomain::ObjectivePropagation::shouldBePropagated() const {
  if (isPropagated) return false;
  if (numInfObjLower > 1) return false;
  if (domain->infeasible_) return false;
  double upperLimit = domain->mipsolver->mipdata_->upper_limit;
  if (upperLimit == kHighsInf) return false;
  if (upperLimit - double(objectiveLower) > capacityThreshold) return false;

  return true;
}